

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_memcpy(void *dest_,void *src_,size_t units)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_t *src;
  size_t *dest;
  
  uVar3 = units * 2;
  if (7 < units) {
    do {
      uVar1 = *(undefined8 *)((long)src_ + 8);
      *(undefined8 *)dest_ = *src_;
      *(undefined8 *)((long)dest_ + 8) = uVar1;
      uVar1 = *(undefined8 *)((long)src_ + 0x18);
      *(undefined8 *)((long)dest_ + 0x10) = *(undefined8 *)((long)src_ + 0x10);
      *(undefined8 *)((long)dest_ + 0x18) = uVar1;
      uVar1 = *(undefined8 *)((long)src_ + 0x28);
      *(undefined8 *)((long)dest_ + 0x20) = *(undefined8 *)((long)src_ + 0x20);
      *(undefined8 *)((long)dest_ + 0x28) = uVar1;
      uVar1 = *(undefined8 *)((long)src_ + 0x38);
      *(undefined8 *)((long)dest_ + 0x30) = *(undefined8 *)((long)src_ + 0x30);
      *(undefined8 *)((long)dest_ + 0x38) = uVar1;
      uVar1 = *(undefined8 *)((long)src_ + 0x48);
      *(undefined8 *)((long)dest_ + 0x40) = *(undefined8 *)((long)src_ + 0x40);
      *(undefined8 *)((long)dest_ + 0x48) = uVar1;
      uVar1 = *(undefined8 *)((long)src_ + 0x58);
      *(undefined8 *)((long)dest_ + 0x50) = *(undefined8 *)((long)src_ + 0x50);
      *(undefined8 *)((long)dest_ + 0x58) = uVar1;
      uVar1 = *(undefined8 *)((long)src_ + 0x68);
      *(undefined8 *)((long)dest_ + 0x60) = *(undefined8 *)((long)src_ + 0x60);
      *(undefined8 *)((long)dest_ + 0x68) = uVar1;
      uVar1 = *(undefined8 *)((long)src_ + 0x78);
      *(undefined8 *)((long)dest_ + 0x70) = *(undefined8 *)((long)src_ + 0x70);
      *(undefined8 *)((long)dest_ + 0x78) = uVar1;
      dest_ = (void *)((long)dest_ + 0x80);
      src_ = (void *)((long)src_ + 0x80);
      uVar3 = uVar3 - 0x10;
    } while (0xf < uVar3);
  }
  switch(uVar3) {
  case 0xe:
    uVar1 = *src_;
    uVar2 = *(undefined8 *)((long)src_ + 8);
    src_ = (void *)((long)src_ + 0x10);
    *(undefined8 *)dest_ = uVar1;
    *(undefined8 *)((long)dest_ + 8) = uVar2;
    dest_ = (void *)((long)dest_ + 0x10);
  case 0xc:
    uVar1 = *src_;
    uVar2 = *(undefined8 *)((long)src_ + 8);
    src_ = (void *)((long)src_ + 0x10);
    *(undefined8 *)dest_ = uVar1;
    *(undefined8 *)((long)dest_ + 8) = uVar2;
    dest_ = (void *)((long)dest_ + 0x10);
  case 10:
    uVar1 = *src_;
    uVar2 = *(undefined8 *)((long)src_ + 8);
    src_ = (void *)((long)src_ + 0x10);
    *(undefined8 *)dest_ = uVar1;
    *(undefined8 *)((long)dest_ + 8) = uVar2;
    dest_ = (void *)((long)dest_ + 0x10);
  case 8:
    uVar1 = *src_;
    uVar2 = *(undefined8 *)((long)src_ + 8);
    src_ = (void *)((long)src_ + 0x10);
    *(undefined8 *)dest_ = uVar1;
    *(undefined8 *)((long)dest_ + 8) = uVar2;
    dest_ = (void *)((long)dest_ + 0x10);
  case 6:
    uVar1 = *src_;
    uVar2 = *(undefined8 *)((long)src_ + 8);
    src_ = (void *)((long)src_ + 0x10);
    *(undefined8 *)dest_ = uVar1;
    *(undefined8 *)((long)dest_ + 8) = uVar2;
    dest_ = (void *)((long)dest_ + 0x10);
  case 4:
    uVar1 = *src_;
    uVar2 = *(undefined8 *)((long)src_ + 8);
    src_ = (void *)((long)src_ + 0x10);
    *(undefined8 *)dest_ = uVar1;
    *(undefined8 *)((long)dest_ + 8) = uVar2;
    dest_ = (void *)((long)dest_ + 0x10);
  case 2:
    uVar1 = *(undefined8 *)((long)src_ + 8);
    *(undefined8 *)dest_ = *src_;
    *(undefined8 *)((long)dest_ + 8) = uVar1;
    return;
  default:
    return;
  }
}

Assistant:

static inline void fio_memcpy(void *__restrict dest_, void *__restrict src_,
                              size_t units) {
#if __SIZEOF_INT128__ == 9 /* a 128bit type exists... but tests favor 64bit */
  register __uint128_t *dest = dest_;
  register __uint128_t *src = src_;
#elif SIZE_MAX == 0xFFFFFFFFFFFFFFFF /* 64 bit size_t */
  register size_t *dest = dest_;
  register size_t *src = src_;
  units = units << 1;
#elif SIZE_MAX == 0xFFFFFFFF         /* 32 bit size_t */
  register size_t *dest = dest_;
  register size_t *src = src_;
  units = units << 2;
#else                                /* unknow... assume 16 bit? */
  register size_t *dest = dest_;
  register size_t *src = src_;
  units = units << 3;
#endif
  while (units >= 16) { /* unroll loop */
    dest[0] = src[0];
    dest[1] = src[1];
    dest[2] = src[2];
    dest[3] = src[3];
    dest[4] = src[4];
    dest[5] = src[5];
    dest[6] = src[6];
    dest[7] = src[7];
    dest[8] = src[8];
    dest[9] = src[9];
    dest[10] = src[10];
    dest[11] = src[11];
    dest[12] = src[12];
    dest[13] = src[13];
    dest[14] = src[14];
    dest[15] = src[15];
    dest += 16;
    src += 16;
    units -= 16;
  }
  switch (units) {
  case 15:
    *(dest++) = *(src++); /* fallthrough */
  case 14:
    *(dest++) = *(src++); /* fallthrough */
  case 13:
    *(dest++) = *(src++); /* fallthrough */
  case 12:
    *(dest++) = *(src++); /* fallthrough */
  case 11:
    *(dest++) = *(src++); /* fallthrough */
  case 10:
    *(dest++) = *(src++); /* fallthrough */
  case 9:
    *(dest++) = *(src++); /* fallthrough */
  case 8:
    *(dest++) = *(src++); /* fallthrough */
  case 7:
    *(dest++) = *(src++); /* fallthrough */
  case 6:
    *(dest++) = *(src++); /* fallthrough */
  case 5:
    *(dest++) = *(src++); /* fallthrough */
  case 4:
    *(dest++) = *(src++); /* fallthrough */
  case 3:
    *(dest++) = *(src++); /* fallthrough */
  case 2:
    *(dest++) = *(src++); /* fallthrough */
  case 1:
    *(dest++) = *(src++);
  }
}